

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlCheckImplied(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  int iVar1;
  int local_1c;
  int i;
  xmlChar *newtag_local;
  htmlParserCtxtPtr ctxt_local;
  
  if ((((ctxt->options & 0x2000U) == 0) && (htmlOmittedDefaultValue != 0)) &&
     (iVar1 = xmlStrEqual(newtag,"html"), iVar1 == 0)) {
    if (((ctxt->nameNr < 1) && (htmlnamePush(ctxt,"html"), ctxt->sax != (_xmlSAXHandler *)0x0)) &&
       (ctxt->sax->startElement != (startElementSAXFunc)0x0)) {
      (*ctxt->sax->startElement)(ctxt->userData,"html",(xmlChar **)0x0);
    }
    iVar1 = xmlStrEqual(newtag,"body");
    if ((iVar1 == 0) && (iVar1 = xmlStrEqual(newtag,"head"), iVar1 == 0)) {
      if ((ctxt->nameNr < 2) &&
         (((((iVar1 = xmlStrEqual(newtag,"script"), iVar1 != 0 ||
             (iVar1 = xmlStrEqual(newtag,"style"), iVar1 != 0)) ||
            (iVar1 = xmlStrEqual(newtag,(xmlChar *)"meta"), iVar1 != 0)) ||
           ((iVar1 = xmlStrEqual(newtag,"link"), iVar1 != 0 ||
            (iVar1 = xmlStrEqual(newtag,(xmlChar *)"title"), iVar1 != 0)))) ||
          (iVar1 = xmlStrEqual(newtag,"base"), iVar1 != 0)))) {
        if (((ctxt->html < 3) && (htmlnamePush(ctxt,"head"), ctxt->sax != (_xmlSAXHandler *)0x0)) &&
           (ctxt->sax->startElement != (startElementSAXFunc)0x0)) {
          (*ctxt->sax->startElement)(ctxt->userData,"head",(xmlChar **)0x0);
        }
      }
      else {
        iVar1 = xmlStrEqual(newtag,(xmlChar *)"noframes");
        if (((iVar1 == 0) && (iVar1 = xmlStrEqual(newtag,"frame"), iVar1 == 0)) &&
           ((iVar1 = xmlStrEqual(newtag,(xmlChar *)"frameset"), iVar1 == 0 && (ctxt->html < 10)))) {
          for (local_1c = 0; local_1c < ctxt->nameNr; local_1c = local_1c + 1) {
            iVar1 = xmlStrEqual(ctxt->nameTab[local_1c],"body");
            if (iVar1 != 0) {
              return;
            }
            iVar1 = xmlStrEqual(ctxt->nameTab[local_1c],"head");
            if (iVar1 != 0) {
              return;
            }
          }
          htmlnamePush(ctxt,"body");
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (ctxt->sax->startElement != (startElementSAXFunc)0x0)) {
            (*ctxt->sax->startElement)(ctxt->userData,"body",(xmlChar **)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
htmlCheckImplied(htmlParserCtxtPtr ctxt, const xmlChar *newtag) {
    int i;

    if (ctxt->options & HTML_PARSE_NOIMPLIED)
        return;
    if (!htmlOmittedDefaultValue)
	return;
    if (xmlStrEqual(newtag, BAD_CAST"html"))
	return;
    if (ctxt->nameNr <= 0) {
	htmlnamePush(ctxt, BAD_CAST"html");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"html", NULL);
    }
    if ((xmlStrEqual(newtag, BAD_CAST"body")) || (xmlStrEqual(newtag, BAD_CAST"head")))
        return;
    if ((ctxt->nameNr <= 1) &&
        ((xmlStrEqual(newtag, BAD_CAST"script")) ||
	 (xmlStrEqual(newtag, BAD_CAST"style")) ||
	 (xmlStrEqual(newtag, BAD_CAST"meta")) ||
	 (xmlStrEqual(newtag, BAD_CAST"link")) ||
	 (xmlStrEqual(newtag, BAD_CAST"title")) ||
	 (xmlStrEqual(newtag, BAD_CAST"base")))) {
        if (ctxt->html >= 3) {
            /* we already saw or generated an <head> before */
            return;
        }
        /*
         * dropped OBJECT ... i you put it first BODY will be
         * assumed !
         */
        htmlnamePush(ctxt, BAD_CAST"head");
        if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
            ctxt->sax->startElement(ctxt->userData, BAD_CAST"head", NULL);
    } else if ((!xmlStrEqual(newtag, BAD_CAST"noframes")) &&
	       (!xmlStrEqual(newtag, BAD_CAST"frame")) &&
	       (!xmlStrEqual(newtag, BAD_CAST"frameset"))) {
        if (ctxt->html >= 10) {
            /* we already saw or generated a <body> before */
            return;
        }
	for (i = 0;i < ctxt->nameNr;i++) {
	    if (xmlStrEqual(ctxt->nameTab[i], BAD_CAST"body")) {
		return;
	    }
	    if (xmlStrEqual(ctxt->nameTab[i], BAD_CAST"head")) {
		return;
	    }
	}

	htmlnamePush(ctxt, BAD_CAST"body");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"body", NULL);
    }
}